

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::siblings_expansion
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,Siblings *siblings,int k
          )

{
  pointer ppVar1;
  Dictionary_it s_h;
  Dictionary_it local_38;
  Dictionary_it local_30;
  
  if (-1 < k) {
    if (k < this->dimension_) {
      this->dimension_ = k;
    }
    if (k == 0) {
      return;
    }
  }
  ppVar1 = (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
  if (ppVar1 != (pointer)0x0) {
    if ((siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size != 0) {
      local_30.m_ptr =
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
            *)ppVar1;
      do {
        local_30.m_ptr = local_30.m_ptr + 1;
        local_38.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)ppVar1;
        create_expansion<false>
                  (this,siblings,&local_38,&local_30,(Filtration_value *)&ppVar1->second,k,
                   (vector<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                    *)0x0);
        if ((local_38.m_ptr ==
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)0x0) ||
           (ppVar1 = (pointer)(local_38.m_ptr + 1),
           local_38.m_ptr =
                (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                 *)ppVar1,
           local_30.m_ptr ==
           (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
            *)0x0)) goto LAB_00115dea;
      } while (ppVar1 != (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_start +
                         (siblings->members_).m_flat_tree.m_data.m_seq.m_holder.m_size);
    }
    return;
  }
LAB_00115dea:
  __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x98,
                "vec_iterator<Pointer, IsConst> &boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, false>::operator++() [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>> *, IsConst = false]"
               );
}

Assistant:

void siblings_expansion(Siblings * siblings,  // must contain elements
                          int k) {
    if (k >= 0 && dimension_ > k) {
      dimension_ = k;
    }
    if (k == 0)
      return;
    Dictionary_it next = siblings->members().begin();
    ++next;

    for (Dictionary_it s_h = siblings->members().begin();
         s_h != siblings->members().end(); ++s_h, ++next)
    {
      create_expansion<false>(siblings, s_h, next, s_h->second.filtration(), k);
    }
  }